

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

TString * user_defined_type_name(LexState *ls,TString *typename)

{
  int iVar1;
  TString *pTVar2;
  size_t sVar3;
  ulong uVar4;
  size_t newlen;
  char *str;
  char buffer [128];
  size_t local_20;
  size_t len;
  TString *typename_local;
  LexState *ls_local;
  
  iVar1 = testnext(ls,0x2e);
  len = (size_t)typename;
  if (iVar1 != 0) {
    memset(&str,0,0x80);
    local_20 = strlen((char *)(typename + 1));
    if (0x7f < local_20) {
      luaX_syntaxerror(ls,"User defined type name is too long");
    }
    snprintf((char *)&str,0x80,"%s",typename + 1);
    do {
      pTVar2 = str_checkname(ls);
      sVar3 = strlen((char *)(pTVar2 + 1));
      uVar4 = local_20 + sVar3 + 1;
      if (0x7f < uVar4) {
        luaX_syntaxerror(ls,"User defined type name is too long");
      }
      snprintf(buffer + (local_20 - 8),0x80 - local_20,".%s",pTVar2 + 1);
      iVar1 = testnext(ls,0x2e);
      local_20 = uVar4;
    } while (iVar1 != 0);
    sVar3 = strlen((char *)&str);
    len = (size_t)luaX_newstring(ls,(char *)&str,sVar3);
  }
  return (TString *)len;
}

Assistant:

static TString *user_defined_type_name(LexState *ls, TString *typename) {
  size_t len = 0;
  if (testnext(ls, '.')) {
    char buffer[128] = {0};
    const char *str = getstr(typename);
    len = strlen(str);
    if (len >= sizeof buffer) {
      luaX_syntaxerror(ls, "User defined type name is too long");
      return typename;
    }
    snprintf(buffer, sizeof buffer, "%s", str);
    do {
      typename = str_checkname(ls);
      str = getstr(typename);
      size_t newlen = len + strlen(str) + 1;
      if (newlen >= sizeof buffer) {
        luaX_syntaxerror(ls, "User defined type name is too long");
        return typename;
      }
      snprintf(buffer + len, sizeof buffer - len, ".%s", str);
      len = newlen;
    } while (testnext(ls, '.'));
    typename = luaX_newstring(ls, buffer, strlen(buffer));
  }
  return typename;
}